

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

int __thiscall filtered_union_find::link(filtered_union_find *this,char *__from,char *__to)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  pointer puVar4;
  index_t iVar5;
  index_t iVar6;
  
  iVar5 = find(this,(index_t)__from);
  iVar6 = find(this,(index_t)__to);
  if (iVar5 != iVar6) {
    pfVar3 = (this->filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar1 = pfVar3[iVar5];
    fVar2 = pfVar3[iVar6];
    if ((fVar1 < fVar2) ||
       (((fVar1 == fVar2 && (!NAN(fVar1) && !NAN(fVar2))) &&
        (puVar4 = (this->rank).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start, puVar4[iVar6] < puVar4[iVar5])))) {
      (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar6] = iVar5;
    }
    else {
      (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar5] = iVar6;
      puVar4 = (this->rank).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar4[iVar5] == puVar4[iVar6]) {
        puVar4[iVar6] = puVar4[iVar6] + '\x01';
      }
    }
  }
  return iVar6;
}

Assistant:

void link(index_t x, index_t y) {
		x = find(x);
		y = find(y);
		if (x == y) return;
		if (filtration[x] < filtration[y] || (filtration[x] == filtration[y] && rank[x] > rank[y]))
			parent[y] = x;
		else {
			parent[x] = y;
			if (rank[x] == rank[y]) ++rank[y];
		}
	}